

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_ShadowingWorks_Test::~SemanticAnalyserTest_ShadowingWorks_Test
          (SemanticAnalyserTest_ShadowingWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, ShadowingWorks)
{
  std::string source = R"SRC(
  
  let test: function = \(x: f32): f32 = { ret x + 1; };

  fn main(): f32
  {
    let test: f32 = 12;
    let x: f32 = 12 * test;

    ret 0;
  }
  )SRC";
  nothrowTest(source);
}